

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cpp
# Opt level: O1

int main(void)

{
  Result RVar1;
  int iVar2;
  int *piVar3;
  Coro coroutine;
  SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime> local_78;
  timespec local_40;
  
  local_78.super_type.
  super_RecordTime<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_PrintPollAttempts,_WaitForExpiry,_RecordTime,_Initial>_>
  .
  super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_PrintPollAttempts,_WaitForExpiry,_RecordTime,_Initial>
  .
  super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>_>
  .
  super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>
  .
  super_WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_RecordTime,_Initial>_>
  .
  super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_RecordTime,_Initial>
  .
  super_RecordTime<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_Initial>_>
  .
  super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_Initial>
  .super_Initial<SCoro::Impl::Nothing>.wait_time.__r =
       (Initial<SCoro::Impl::Nothing>)(duration)0x3b9aca00;
  local_78.super_type.
  super_RecordTime<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_PrintPollAttempts,_WaitForExpiry,_RecordTime,_Initial>_>
  .
  super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_PrintPollAttempts,_WaitForExpiry,_RecordTime,_Initial>
  .
  super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>_>
  .
  super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>
  .
  super_WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_RecordTime,_Initial>_>
  .
  super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_RecordTime,_Initial>
  .
  super_RecordTime<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_Initial>_>
  .start_time.__d.__r = (duration)0;
  local_78.super_type.
  super_RecordTime<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_PrintPollAttempts,_WaitForExpiry,_RecordTime,_Initial>_>
  .
  super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_PrintPollAttempts,_WaitForExpiry,_RecordTime,_Initial>
  .
  super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>_>
  .
  super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>
  .
  super_WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_RecordTime,_Initial>_>
  .retries = 0;
  local_78.super_type.
  super_RecordTime<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_PrintPollAttempts,_WaitForExpiry,_RecordTime,_Initial>_>
  .
  super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_PrintPollAttempts,_WaitForExpiry,_RecordTime,_Initial>
  .
  super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>_>
  .
  super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>
  .
  super_WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_RecordTime,_Initial>_>
  ._20_4_ = 0;
  local_78.super_type.
  super_RecordTime<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_PrintPollAttempts,_WaitForExpiry,_RecordTime,_Initial>_>
  .
  super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_PrintPollAttempts,_WaitForExpiry,_RecordTime,_Initial>
  .
  super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>_>
  .nested_state.super_EboIndex<2UL>.index = (EboIndex<2UL>)0;
  local_78.super_type.
  super_RecordTime<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_PrintPollAttempts,_WaitForExpiry,_RecordTime,_Initial>_>
  .start_time.__d.__r = (duration)0;
  local_78.super_EboIndex<5UL>.index = 0;
  do {
    while ((RVar1 = (*SCoro::Impl::
                      GetImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL>_>
                      ::lut[local_78.super_EboIndex<5UL>.index])(&local_78), RVar1.value != Yield &&
           ((RVar1.value != Next ||
            (local_78.super_EboIndex<5UL>.index = local_78.super_EboIndex<5UL>.index + 1,
            4 < local_78.super_EboIndex<5UL>.index))))) {
      puts("\n");
      local_78.super_type.
      super_RecordTime<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_PrintPollAttempts,_WaitForExpiry,_RecordTime,_Initial>_>
      .
      super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_PrintPollAttempts,_WaitForExpiry,_RecordTime,_Initial>
      .
      super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>_>
      .
      super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>
      .
      super_WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_RecordTime,_Initial>_>
      .
      super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_RecordTime,_Initial>
      .
      super_RecordTime<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_Initial>_>
      .
      super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_Initial>
      .super_Initial<SCoro::Impl::Nothing>.wait_time.__r =
           (Initial<SCoro::Impl::Nothing>)(duration)0x3b9aca00;
      local_78.super_type.
      super_RecordTime<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_PrintPollAttempts,_WaitForExpiry,_RecordTime,_Initial>_>
      .
      super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_PrintPollAttempts,_WaitForExpiry,_RecordTime,_Initial>
      .
      super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>_>
      .
      super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>
      .
      super_WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_RecordTime,_Initial>_>
      .
      super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_RecordTime,_Initial>
      .
      super_RecordTime<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_Initial>_>
      .start_time.__d.__r = (duration)0;
      local_78.super_type.
      super_RecordTime<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_PrintPollAttempts,_WaitForExpiry,_RecordTime,_Initial>_>
      .
      super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_PrintPollAttempts,_WaitForExpiry,_RecordTime,_Initial>
      .
      super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>_>
      .
      super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>
      .
      super_WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_RecordTime,_Initial>_>
      .retries = 0;
      local_78.super_type.
      super_RecordTime<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_PrintPollAttempts,_WaitForExpiry,_RecordTime,_Initial>_>
      .
      super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_PrintPollAttempts,_WaitForExpiry,_RecordTime,_Initial>
      .
      super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>_>
      .
      super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>
      .
      super_WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_RecordTime,_Initial>_>
      ._20_4_ = 0;
      local_78.super_EboIndex<5UL>.index = 0;
      local_78.super_type.
      super_RecordTime<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_PrintPollAttempts,_WaitForExpiry,_RecordTime,_Initial>_>
      .
      super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_PrintPollAttempts,_WaitForExpiry,_RecordTime,_Initial>
      .
      super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>_>
      .nested_state.super_EboIndex<2UL>.index = (EboIndex<2UL>)0;
      local_78.super_type.
      super_RecordTime<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_PrintPollAttempts,_WaitForExpiry,_RecordTime,_Initial>_>
      .start_time.__d.__r = (duration)0;
    }
    putchar(0x2d);
    local_40.tv_sec = 0;
    local_40.tv_nsec = 10000000;
    do {
      iVar2 = nanosleep(&local_40,&local_40);
      if (iVar2 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
  } while( true );
}

Assistant:

int main()
{
    auto coroutine = Coro{};
    while (true)
    {
        while (coroutine.Poll())
        {
            std::printf("-");
            std::this_thread::sleep_for(std::chrono::milliseconds{10});
        }
        std::printf("\n\n");
        coroutine.Reset();
    }
    return 0;
}